

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O1

void __thiscall DStrifeStatusBar::DrawPopScreen(DStrifeStatusBar *this,int bottom)

{
  FImageCollection *this_00;
  BYTE *string;
  APlayerPawn *pAVar1;
  FBrokenLines *pFVar2;
  int iVar3;
  int iVar4;
  DFrameBuffer *pDVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  FTexture *pFVar10;
  FBrokenLines *lines;
  undefined4 extraout_var;
  AInventory *pAVar11;
  ulong uVar12;
  undefined4 extraout_var_00;
  PClass *pPVar13;
  char *string_00;
  AInventory *pAVar14;
  PClass *pPVar15;
  PClassActor *type;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  FBrokenLines *pFVar23;
  long lVar24;
  bool bVar25;
  uint local_e8;
  FName local_9c;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  FName local_7c;
  char buff [64];
  
  pDVar5 = screen;
  iVar4 = CleanYfac;
  iVar3 = CleanXfac;
  uVar6 = (uint)(this->CurrentPop == 3);
  local_e8 = uVar6 ^ 5;
  uVar16 = (int)((double)this->PopHeightChange * r_TicFracF) + this->PopHeight;
  uVar16 = (int)uVar16 >> 0x1f & uVar16;
  uVar9 = 0xffffff98;
  if (-0x68 < (int)uVar16) {
    uVar9 = uVar16;
  }
  iVar22 = (screen->super_DSimpleCanvas).super_DCanvas.Width / 2 + CleanXfac * -0xa0;
  iVar20 = uVar9 * CleanYfac + bottom;
  this_00 = &this->Images;
  pFVar10 = FImageCollection::operator[](this_00,uVar6 ^ 7);
  DCanvas::DrawTexture
            ((DCanvas *)pDVar5,pFVar10,(double)iVar22,(double)iVar20,0x40001393,0x3fe8000000000000,1
             ,0x4000138c,0);
  pDVar5 = screen;
  pFVar10 = FImageCollection::operator[](this_00,local_e8);
  DCanvas::DrawTexture((DCanvas *)pDVar5,pFVar10,(double)iVar22,(double)iVar20,0x40001393,1,0);
  iVar21 = this->CurrentPop;
  if (iVar21 == 3) {
    iVar17 = iVar3 * 0x10c + iVar22;
    iVar21 = iVar3 * 7;
    DrINumber2(this,(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy,iVar17,
               iVar4 * 0x1c + iVar20,iVar21,0x13);
    DrINumber2(this,(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina,iVar17,
               iVar4 * 0x34 + iVar20,iVar21,0x13);
    pAVar1 = ((this->super_DBaseStatusBar).CPlayer)->mo;
    pAVar11 = (pAVar1->super_AActor).Inventory.field_0.p;
    if ((pAVar11 != (AInventory *)0x0) &&
       (((pAVar11->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar1->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar11 = (AInventory *)0x0;
    }
    iVar7 = 0;
    pPVar15 = AKey::RegistrationInfo.MyClass;
    while (AKey::RegistrationInfo.MyClass = pPVar15, pAVar11 != (AInventory *)0x0) {
      if ((pAVar11->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar8 = (**(pAVar11->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar11);
        (pAVar11->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar8);
      }
      pPVar13 = (pAVar11->super_AActor).super_DThinker.super_DObject.Class;
      bVar25 = pPVar13 != (PClass *)0x0;
      if (pPVar13 != pPVar15 && bVar25) {
        do {
          pPVar13 = pPVar13->ParentClass;
          bVar25 = pPVar13 != (PClass *)0x0;
          if (pPVar13 == pPVar15) break;
        } while (pPVar13 != (PClass *)0x0);
      }
      pAVar14 = (pAVar11->super_AActor).Inventory.field_0.p;
      if ((pAVar14 != (AInventory *)0x0) &&
         (((pAVar14->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar11->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
        pAVar14 = (AInventory *)0x0;
      }
      iVar7 = iVar7 + (uint)bVar25;
      pAVar11 = pAVar14;
      pPVar15 = AKey::RegistrationInfo.MyClass;
    }
    DrINumber2(this,iVar7,iVar17,iVar4 * 0x4c + iVar20,iVar21,0x13);
    local_7c.Index = 0x113;
    pAVar11 = AActor::FindInventory
                        (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,&local_7c);
    if (pAVar11 != (AInventory *)0x0) {
      uVar12 = (ulong)(pAVar11->Icon).texnum;
      if (uVar12 < TexMan.Textures.Count) {
        pFVar10 = TexMan.Textures.Array[TexMan.Translation.Array[uVar12]].Texture;
      }
      else {
        pFVar10 = (FTexture *)0x0;
      }
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar10,(double)(iVar3 * 0x118 + iVar22),
                 (double)(iVar4 * 0x4a + iVar20),0x40001393,1,0);
    }
    lVar24 = 0;
    do {
      buff._0_4_ = DrawPopScreen::AmmoList[lVar24].AmmoType;
      pPVar15 = PClass::FindClass((FName *)buff);
      type = dyn_cast<PClassActor>((DObject *)pPVar15);
      pAVar11 = AActor::FindInventory
                          (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,type,false);
      pDVar5 = screen;
      if (pAVar11 == (AInventory *)0x0) {
        iVar7 = DrawPopScreen::AmmoList[lVar24].Y * iVar4 + iVar20;
        pFVar10 = FImageCollection::operator[](this_00,0x13);
        DCanvas::DrawTexture
                  ((DCanvas *)pDVar5,pFVar10,(double)(iVar3 * 199 + iVar22),(double)iVar7,0x40001393
                   ,1,0);
        iVar17 = *(int *)((type->super_PClass).Defaults + 0x4cc);
      }
      else {
        iVar7 = DrawPopScreen::AmmoList[lVar24].Y * iVar4 + iVar20;
        DrINumber2(this,pAVar11->Amount,iVar3 * 0xce + iVar22,iVar7,iVar21,0x13);
        iVar17 = pAVar11->MaxAmount;
      }
      DrINumber2(this,iVar17,iVar3 * 0xef + iVar22,iVar7,iVar21,0x13);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 7);
    lVar24 = 8;
    do {
      local_9c.Index = *(int *)(&UNK_00617438 + lVar24);
      pAVar11 = AActor::FindInventory
                          (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,&local_9c);
      if (pAVar11 != (AInventory *)0x0) {
        uVar12 = (ulong)(pAVar11->Icon).texnum;
        if (uVar12 < TexMan.Textures.Count) {
          pFVar10 = TexMan.Textures.Array[TexMan.Translation.Array[uVar12]].Texture;
        }
        else {
          pFVar10 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar10,
                   (double)(*(int *)(&UNK_0061743c + lVar24) * iVar3 + iVar22),
                   (double)(*(int *)((long)&DrawPopScreen::WeaponList[0].TypeName + lVar24) * iVar4
                           + iVar20),0x40001393,1,0x4000139c,0,0x4000139b,0,0);
      }
      lVar24 = lVar24 + 0xc;
    } while (lVar24 != 0x50);
  }
  else if (iVar21 == 2) {
    iVar21 = this->KeyPopPos;
    if (this->KeyPopScroll < 1) {
      iVar17 = 0x14;
      iVar7 = iVar21;
    }
    else {
      iVar7 = this->KeyPopScroll - (int)(r_TicFracF * 25.454545454545453);
      iVar17 = 0;
      if (0 < iVar7) {
        iVar17 = iVar7;
      }
      iVar17 = iVar17 + -0x104;
      iVar7 = iVar21 + -10;
    }
    pAVar1 = ((this->super_DBaseStatusBar).CPlayer)->mo;
    pAVar11 = (pAVar1->super_AActor).Inventory.field_0.p;
    if ((pAVar11 != (AInventory *)0x0) &&
       (((pAVar11->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar1->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar11 = (AInventory *)0x0;
    }
    if (pAVar11 != (AInventory *)0x0 && -10 < iVar21) {
      uVar12 = (ulong)(iVar21 + 10);
      uVar18 = (ulong)(uint)(iVar3 * 0x11 + iVar22);
      local_98 = (ulong)(uint)(iVar3 * 0x12f + iVar22);
      iVar21 = 0;
      local_90 = uVar12;
      do {
        pPVar15 = AKey::RegistrationInfo.MyClass;
        if ((pAVar11->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar8 = (**(pAVar11->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar11);
          (pAVar11->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var_00,iVar8);
        }
        pPVar13 = (pAVar11->super_AActor).super_DThinker.super_DObject.Class;
        bVar25 = pPVar13 != (PClass *)0x0;
        if (pPVar13 != pPVar15 && bVar25) {
          do {
            pPVar13 = pPVar13->ParentClass;
            bVar25 = pPVar13 != (PClass *)0x0;
            if (pPVar13 == pPVar15) break;
          } while (pPVar13 != (PClass *)0x0);
        }
        if (bVar25) {
          if (iVar21 < iVar7) {
            iVar21 = iVar21 + 1;
          }
          else {
            string_00 = AActor::GetTag(&pAVar11->super_AActor,(char *)0x0);
            uVar12 = local_98;
            uVar19 = (ulong)(pAVar11->Icon).texnum;
            pFVar10 = (FTexture *)0x0;
            if (uVar19 < TexMan.Textures.Count) {
              pFVar10 = TexMan.Textures.Array[TexMan.Translation.Array[uVar19]].Texture;
            }
            iVar8 = (iVar21 % 5) * 0x12;
            uVar9 = ((uint)(0 < this->KeyPopScroll) * 2 + 1 & (iVar21 - iVar7) / 5) * 0x8c;
            local_88 = (ulong)uVar9;
            DCanvas::DrawTexture
                      ((DCanvas *)screen,pFVar10,(double)(int)((uVar9 + iVar17) * iVar3 + iVar22),
                       (double)((iVar8 + 6) * iVar4 + iVar20),0x40001393,1,0x400013a3,uVar18,
                       0x400013a4,local_98,0);
            DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,
                              (iVar17 + (int)local_88 + 0x11) * iVar3 + iVar22,
                              (iVar8 + 0xb) * iVar4 + iVar20,string_00,0x40001393,1,0x400013a3,
                              uVar18,0x400013a4,uVar12,0);
            iVar21 = iVar21 + 1;
            uVar12 = local_90;
          }
        }
        pAVar14 = (pAVar11->super_AActor).Inventory.field_0.p;
        if ((pAVar14 != (AInventory *)0x0) &&
           (((pAVar14->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar11->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar14 = (AInventory *)0x0;
        }
      } while ((pAVar14 != (AInventory *)0x0) && (pAVar11 = pAVar14, iVar21 < (int)uVar12));
    }
  }
  else if (iVar21 == 1) {
    iVar21 = (int)(((long)level.time * 0x62) / 0xdac);
    mysnprintf(buff,0x40,"%02d:%02d:%02d",(ulong)(uint)(iVar21 / 0xe10),
               (ulong)(uint)((iVar21 % 0xe10) / 0x3c),(ulong)(uint)(iVar21 % 0x3c));
    DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,iVar3 * 0xd2 + iVar22,iVar20 + iVar4 * 8,buff
                      ,0x40001393,1,0);
    string = (BYTE *)(((this->super_DBaseStatusBar).CPlayer)->LogText).Chars;
    if (*(int *)(string + -0xc) != 0) {
      lines = V_BreakLines(SmallFont2,0x110,string,false);
      if (-1 < lines->Width) {
        iVar21 = bottom + (uVar9 + 0x12) * iVar4;
        pFVar2 = lines;
        do {
          pFVar23 = pFVar2 + 1;
          DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,iVar22 + iVar3 * 0x18,iVar21,
                            (pFVar2->Text).Chars,0x40001393,1,0);
          iVar21 = iVar21 + iVar4 * 0xc;
          pFVar2 = pFVar23;
        } while (-1 < pFVar23->Width);
      }
      V_FreeBrokenLines(lines);
    }
  }
  return;
}

Assistant:

void DrawPopScreen (int bottom)
	{
		char buff[64];
		const char *label;
		int i;
		AInventory *item;
		int xscale, yscale, left, top;
		int bars = (CurrentPop == POP_Status) ? imgINVPOP : imgINVPOP2;
		int back = (CurrentPop == POP_Status) ? imgINVPBAK : imgINVPBAK2;
		// Extrapolate the height of the popscreen for smoother movement
		int height = clamp<int> (PopHeight + int(r_TicFracF * PopHeightChange), -POP_HEIGHT, 0);

		xscale = CleanXfac;
		yscale = CleanYfac;
		left = screen->GetWidth()/2 - 160*CleanXfac;
		top = bottom + height * yscale;

		screen->DrawTexture (Images[back], left, top, DTA_CleanNoMove, true, DTA_AlphaF, 0.75, TAG_DONE);
		screen->DrawTexture (Images[bars], left, top, DTA_CleanNoMove, true, TAG_DONE);


		switch (CurrentPop)
		{
		case POP_Log:
		{
			int seconds = Tics2Seconds(level.time);
			// Draw the latest log message.
			mysnprintf(buff, countof(buff), "%02d:%02d:%02d",
				seconds / 3600,
				(seconds % 3600) / 60,
				(seconds) % 60);

			screen->DrawText(SmallFont2, CR_UNTRANSLATED, left + 210 * xscale, top + 8 * yscale, buff,
				DTA_CleanNoMove, true, TAG_DONE);

			if (CPlayer->LogText.IsNotEmpty())
			{
				FBrokenLines *lines = V_BreakLines(SmallFont2, 272, CPlayer->LogText);
				for (i = 0; lines[i].Width >= 0; ++i)
				{
					screen->DrawText(SmallFont2, CR_UNTRANSLATED, left + 24 * xscale, top + (18 + i * 12)*yscale,
						lines[i].Text, DTA_CleanNoMove, true, TAG_DONE);
				}
				V_FreeBrokenLines(lines);
			}
			break;
		}

		case POP_Keys:
			// List the keys the player has.
			int pos, endpos, leftcol;
			int clipleft, clipright;
			
			pos = KeyPopPos;
			endpos = pos + 10;
			leftcol = 20;
			clipleft = left + 17*xscale;
			clipright = left + (320-17)*xscale;
			if (KeyPopScroll > 0)
			{
				// Extrapolate the scroll position for smoother scrolling
				int scroll = MAX<int> (0,KeyPopScroll - int(r_TicFracF * (280./KEY_TIME)));
				pos -= 10;
				leftcol = leftcol - 280 + scroll;
			}
			for (i = 0, item = CPlayer->mo->Inventory;
				i < endpos && item != NULL;
				item = item->Inventory)
			{
				if (!item->IsKindOf (RUNTIME_CLASS(AKey)))
					continue;
				
				if (i < pos)
				{
					i++;
					continue;
				}

				label = item->GetTag();

				int colnum = ((i-pos) / 5) & (KeyPopScroll > 0 ? 3 : 1);
				int rownum = (i % 5) * 18;

				screen->DrawTexture (TexMan(item->Icon),
					left + (colnum * 140 + leftcol)*xscale,
					top + (6 + rownum)*yscale,
					DTA_CleanNoMove, true,
					DTA_ClipLeft, clipleft,
					DTA_ClipRight, clipright,
					TAG_DONE);
				screen->DrawText (SmallFont2, CR_UNTRANSLATED,
					left + (colnum * 140 + leftcol + 17)*xscale,
					top + (11 + rownum)*yscale,
					label,
					DTA_CleanNoMove, true,
					DTA_ClipLeft, clipleft,
					DTA_ClipRight, clipright,
					TAG_DONE);
				i++;
			}
			break;

		case POP_Status:
			// Show miscellaneous status items.
			
			// Print stats
			DrINumber2 (CPlayer->mo->accuracy, left+268*xscale, top+28*yscale, 7*xscale, imgFONY0);
			DrINumber2 (CPlayer->mo->stamina, left+268*xscale, top+52*yscale, 7*xscale, imgFONY0);

			// How many keys does the player have?
			for (i = 0, item = CPlayer->mo->Inventory;
				item != NULL;
				item = item->Inventory)
			{
				if (item->IsKindOf (RUNTIME_CLASS(AKey)))
				{
					i++;
				}
			}
			DrINumber2 (i, left+268*xscale, top+76*yscale, 7*xscale, imgFONY0);

			// Does the player have a communicator?
			item = CPlayer->mo->FindInventory (NAME_Communicator);
			if (item != NULL)
			{
				screen->DrawTexture (TexMan(item->Icon),
					left + 280*xscale,
					top + 74*yscale,
					DTA_CleanNoMove, true, TAG_DONE);
			}

			// How much ammo does the player have?
			static const struct
			{
				ENamedName AmmoType;
				int Y;
			} AmmoList[7] =
			{
				{ NAME_ClipOfBullets,			19 },
				{ NAME_PoisonBolts,				35 },
				{ NAME_ElectricBolts,			43 },
				{ NAME_HEGrenadeRounds,			59 },
				{ NAME_PhosphorusGrenadeRounds,	67 },
				{ NAME_MiniMissiles,			75 },
				{ NAME_EnergyPod,				83 }
			};
			for (i = 0; i < 7; ++i)
			{
				PClassActor *ammotype = PClass::FindActor(AmmoList[i].AmmoType);
				item = CPlayer->mo->FindInventory (ammotype);

				if (item == NULL)
				{
					DrINumber2 (0, left+206*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
					DrINumber2 (((AInventory *)GetDefaultByType (ammotype))->MaxAmount,
						left+239*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
				}
				else
				{
					DrINumber2 (item->Amount, left+206*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
					DrINumber2 (item->MaxAmount, left+239*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
				}
			}

			// What weapons does the player have?
			static const struct
			{
				ENamedName TypeName;
				int X, Y;
			} WeaponList[6] =
			{
				{ NAME_StrifeCrossbow,			23, 19 },
				{ NAME_AssaultGun,				21, 41 },
				{ NAME_FlameThrower,			57, 50 },
				{ NAME_MiniMissileLauncher,		20, 64 },
				{ NAME_StrifeGrenadeLauncher,	55, 20 },
				{ NAME_Mauler,					52, 75 },
			};
			for (i = 0; i < 6; ++i)
			{
				item = CPlayer->mo->FindInventory (WeaponList[i].TypeName);

				if (item != NULL)
				{
					screen->DrawTexture (TexMan(item->Icon),
						left + WeaponList[i].X*xscale,
						top + WeaponList[i].Y*yscale,
						DTA_CleanNoMove, true,
						DTA_LeftOffset, 0,
						DTA_TopOffset, 0,
						TAG_DONE);
				}
			}
			break;
		}
	}